

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

bool __thiscall
ON_3dmObjectAttributes::Internal_WriteV5(ON_3dmObjectAttributes *this,ON_BinaryArchive *file)

{
  bool bVar1;
  SectionAttributesSource SVar2;
  SectionLabelStyle SVar3;
  uint uVar4;
  object_material_source oVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  ON_SectionStyle *this_00;
  ON_Linetype *pOVar9;
  double dVar10;
  bool local_c9;
  ON_Linetype *linetype;
  ON_Xform xform;
  ON_SectionStyle *customSectionStyle;
  int i;
  int count;
  bool rc;
  uchar c;
  uint archive_3dm_version;
  ON_BinaryArchive *file_local;
  ON_3dmObjectAttributes *this_local;
  
  if (this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) {
    uVar4 = ON_BinaryArchive::Archive3dmVersion(file);
    ON_DecalCollection::UpdateUserData(&this->m_private->m_decals,uVar4);
  }
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,2,0xd);
  if (!bVar1) {
    return bVar1;
  }
  if (!bVar1) {
    return bVar1;
  }
  bVar1 = ON_BinaryArchive::WriteUuid(file,&this->m_uuid);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,Layer,this->m_layer_index);
    if (!bVar1) {
      return bVar1;
    }
    bVar1 = ON_wString::IsEmpty(&this->m_name);
    if (!bVar1) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x01');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteString(file,&this->m_name);
      if (!bVar1) {
        return bVar1;
      }
    }
    bVar1 = ON_wString::IsEmpty(&this->m_url);
    if (!bVar1) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x02');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteString(file,&this->m_url);
      if (!bVar1) {
        return bVar1;
      }
    }
    if (this->m_linetype_index != -1) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x03');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                        (file,LinePattern,this->m_linetype_index);
      if (!bVar1) {
        return bVar1;
      }
    }
    if ((this->m_material_index != -1) &&
       (oVar5 = MaterialSource(this), oVar5 == material_from_object)) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x04');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                        (file,Material,this->m_material_index);
      if (!bVar1) {
        return bVar1;
      }
    }
    iVar6 = ON_ClassArray<ON_MappingRef>::Count(&(this->m_rendering_attributes).m_mappings);
    if ((((0 < iVar6) ||
         (iVar6 = ON_ClassArray<ON_MaterialRef>::Count
                            ((ON_ClassArray<ON_MaterialRef> *)&this->m_rendering_attributes),
         0 < iVar6)) || (((this->m_rendering_attributes).m_bCastsShadows & 1U) != 1)) ||
       ((((this->m_rendering_attributes).m_bReceivesShadows & 1U) != 1 ||
        (bVar1 = ON_ObjectRenderingAttributes::AdvancedTexturePreview(&this->m_rendering_attributes)
        , bVar1)))) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x05');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_ObjectRenderingAttributes::Write(&this->m_rendering_attributes,file);
      if (!bVar1) {
        return bVar1;
      }
    }
    uVar4 = ON_Color::operator_cast_to_unsigned_int(&this->m_color);
    if (uVar4 != 0) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x06');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteColor(file,&this->m_color);
      if (!bVar1) {
        return bVar1;
      }
    }
    uVar4 = ON_Color::operator_cast_to_unsigned_int(&this->m_plot_color);
    if (uVar4 != 0) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\a');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteColor(file,&this->m_plot_color);
      if (!bVar1) {
        return bVar1;
      }
    }
    if ((this->m_plot_weight_mm != 0.0) || (NAN(this->m_plot_weight_mm))) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\b');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_plot_weight_mm);
      if (!bVar1) {
        return bVar1;
      }
    }
    if (this->m_object_decoration != no_object_decoration) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\t');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteChar(file,(ON__UINT8)this->m_object_decoration);
      if (!bVar1) {
        return bVar1;
      }
    }
    if (this->m_wire_density != 1) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\n');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_wire_density);
      if (!bVar1) {
        return bVar1;
      }
    }
    if ((this->m_bVisible & 1U) != 1) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\v');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bVisible & 1));
      if (!bVar1) {
        return bVar1;
      }
    }
    if (this->m_mode != '\0') {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\f');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteChar(file,this->m_mode);
      if (!bVar1) {
        return bVar1;
      }
    }
    if (this->m_color_source != '\0') {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\r');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteChar(file,this->m_color_source);
      if (!bVar1) {
        return bVar1;
      }
    }
    if (this->m_plot_color_source != '\0') {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x0e');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteChar(file,this->m_plot_color_source);
      if (!bVar1) {
        return bVar1;
      }
    }
    if (this->m_plot_weight_source != '\0') {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x0f');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteChar(file,this->m_plot_weight_source);
      if (!bVar1) {
        return bVar1;
      }
    }
    if (this->m_material_source != '\0') {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x10');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteChar(file,this->m_material_source);
      if (!bVar1) {
        return bVar1;
      }
    }
    if (this->m_linetype_source != '\0') {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x11');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteChar(file,this->m_linetype_source);
      if (!bVar1) {
        return bVar1;
      }
    }
    iVar6 = ON_SimpleArray<int>::Count(&this->m_group);
    if (0 < iVar6) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x12');
      if (!bVar1) {
        return bVar1;
      }
      iVar6 = ON_SimpleArray<int>::Count(&this->m_group);
      i._2_1_ = ON_BinaryArchive::WriteInt(file,iVar6);
      customSectionStyle._0_4_ = 0;
      while( true ) {
        local_c9 = false;
        if ((int)customSectionStyle < iVar6) {
          local_c9 = i._2_1_;
        }
        if (local_c9 == false) break;
        piVar8 = ON_SimpleArray<int>::operator[](&this->m_group,(int)customSectionStyle);
        i._2_1_ = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,Group,*piVar8);
        customSectionStyle._0_4_ = (int)customSectionStyle + 1;
      }
      if (i._2_1_ == false) {
        return false;
      }
    }
    if (this->m_space != model_space) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x13');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteChar(file,this->m_space);
      if (!bVar1) {
        return bVar1;
      }
    }
    bVar1 = ON_UuidIsNil(&this->m_viewport_id);
    if (!bVar1) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x14');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteUuid(file,&this->m_viewport_id);
      if (!bVar1) {
        return bVar1;
      }
    }
    iVar6 = ON_SimpleArray<ON_DisplayMaterialRef>::Count(&this->m_dmref);
    if (0 < iVar6) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x15');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteArray(file,&this->m_dmref);
      if (!bVar1) {
        return bVar1;
      }
    }
    if (this->m_display_order != 0) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\x16');
      if (!bVar1) {
        return bVar1;
      }
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_display_order);
      if (!bVar1) {
        return bVar1;
      }
    }
    this_00 = CustomSectionStyle(this,(ON_SectionStyle *)0x0);
    if (this->m_private != (ON_3dmObjectAttributesPrivate *)0x0) {
      SVar2 = SectionAttributesSource(this);
      if (SVar2 != FromLayer) {
        bVar1 = ON_BinaryArchive::WriteChar(file,'\x1d');
        if (!bVar1) {
          return bVar1;
        }
        SVar2 = SectionAttributesSource(this);
        bVar1 = ON_BinaryArchive::WriteChar(file,SVar2);
        if (!bVar1) {
          return bVar1;
        }
      }
      dVar10 = LinetypePatternScale(this);
      if (2.220446049250313e-16 < ABS(1.0 - dVar10)) {
        bVar1 = ON_BinaryArchive::WriteChar(file,'!');
        if (!bVar1) {
          return bVar1;
        }
        dVar10 = LinetypePatternScale(this);
        bVar1 = ON_BinaryArchive::WriteDouble(file,dVar10);
        if (!bVar1) {
          return bVar1;
        }
      }
      xform.m_xform[3][3]._4_4_ =
           (anon_union_4_2_6147a14e_for_ON_Color_15)HatchBackgroundFillColor(this);
      uVar4 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)((long)xform.m_xform[3] + 0x1c));
      uVar7 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
      if (uVar4 != uVar7) {
        bVar1 = ON_BinaryArchive::WriteChar(file,'\"');
        if (!bVar1) {
          return bVar1;
        }
        xform.m_xform[3][3]._0_4_ =
             (anon_union_4_2_6147a14e_for_ON_Color_15)HatchBackgroundFillColor(this);
        bVar1 = ON_BinaryArchive::WriteColor(file,(ON_Color *)(xform.m_xform[3] + 3));
        if (!bVar1) {
          return bVar1;
        }
      }
      bVar1 = HatchBoundaryVisible(this);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteChar(file,'#');
        if (!bVar1) {
          return bVar1;
        }
        bVar1 = HatchBoundaryVisible(this);
        bVar1 = ON_BinaryArchive::WriteBool(file,bVar1);
        if (!bVar1) {
          return bVar1;
        }
      }
    }
    bVar1 = ON_Plane::operator!=(&this->m_object_frame,&ON_Plane::UnsetPlane);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'$');
      if (!bVar1) {
        return bVar1;
      }
      ON_Xform::ON_Xform((ON_Xform *)&linetype);
      ON_Xform::ChangeBasis((ON_Xform *)&linetype,&this->m_object_frame,&ON_Plane::World_xy);
      bVar1 = ON_BinaryArchive::WriteXform(file,(ON_Xform *)&linetype);
      if (!bVar1) {
        return bVar1;
      }
    }
    pOVar9 = CustomLinetype(this);
    if (pOVar9 != (ON_Linetype *)0x0) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'&');
      if (!bVar1) {
        return bVar1;
      }
      uVar4 = (*(pOVar9->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[10])(pOVar9,file);
      if ((uVar4 & 1) == 0) {
        return (bool)((byte)uVar4 & 1);
      }
    }
    if ((this_00 != (ON_SectionStyle *)0x0) &&
       (bVar1 = ON_SectionStyle::SectionAttributesEqual(this_00,&ON_SectionStyle::Unset), !bVar1)) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'\'');
      if (!bVar1) {
        return bVar1;
      }
      uVar4 = (*(this_00->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[10])
                        (this_00,file);
      if ((uVar4 & 1) == 0) {
        return (bool)((byte)uVar4 & 1);
      }
    }
    SVar3 = ClippingPlaneLabelStyle(this);
    if (SVar3 != None) {
      bVar1 = ON_BinaryArchive::WriteChar(file,'(');
      if (!bVar1) {
        return bVar1;
      }
      SVar3 = ClippingPlaneLabelStyle(this);
      bVar1 = ON_BinaryArchive::WriteChar(file,SVar3);
      if (!bVar1) {
        return bVar1;
      }
    }
    bVar1 = ON_BinaryArchive::WriteChar(file,'\0');
    return bVar1;
  }
  return bVar1;
}

Assistant:

bool ON_3dmObjectAttributes::Internal_WriteV5( ON_BinaryArchive& file ) const
{
  if (m_private)
  {
    // Have the decal collection update the user data if anything has changed and there
    // is actually decal data for which a user data object is needed. Note that this is
    // not actually needed when running Rhino because the RDK decal UI directly updates
    // the user data when changes are made. This is only needed when using ONX_Model and
    // File3dm outside of Rhino, in case the programmer sets a decal property.
    const unsigned int archive_3dm_version = file.Archive3dmVersion();
    m_private->m_decals.UpdateUserData(archive_3dm_version);
  }

  unsigned char c;
  // 29 Nov. 2009 S. Baer
  // Chunk version updated to 2.1 in order to support m_display_order
  // 12 Aug 2021 S. Baer
  // The next minor chunk version should be 3. There was a 24 hour period
  // where files could contain some extra information in a 2.2 chunk
  // 29 Sept 2021 S. Baer
  // Chunk version updated to 2.3 to support ClipParticipationSource and
  // clip participation list
  // 18 Oct 2021 S. Baer
  // Chunk version = 2.4 to support section hatch attributes
  // 5 Nov 2021 S. Baer
  // Chunk version = 2.5 to support linetype scale
  // 10 Jan 2022 S. Baer
  // Chunk version = 2.6 to support hatch background fill and hatch boundary visibility
  // 26 Jan 2022 Andy Le Bihan
  // Chunk version 2.7 was skipped
  // Chunk version = 2.8 to support object frame.
  // 15 Jun 2022 S. Baer
  // Chunk version = 2.9 to support SectionFillRule
  // 30 Nov 2022 S. Baer
  // Chunk version = 2.10 to support custom linetype
  // 18 Apr 2023 S. Baer
  // Chunk version = 2.11 to support custom section style
  // 10 May 2023 S. Baer
  // Chunk version = 2.12 to support ClippingPlaneLabelStyle
  // 11 May 2023 S. Baer
  // Chunk version = 2.13 to support SelectiveClippingListType
  bool rc = file.Write3dmChunkVersion(2,13);
  while(rc)
  {
    if (!rc) break;
    rc = file.WriteUuid(m_uuid);
    if (!rc) break;
    rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::Layer, m_layer_index);
    if (!rc) break;

    // write non-default settings - skip everything else
    if ( !m_name.IsEmpty() )
    {
      c = 1;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteString(m_name);
      if (!rc) break;
    }
    if ( !m_url.IsEmpty() )
    {
      c = 2;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteString(m_url);
      if (!rc) break;
    }
    if ( -1 != m_linetype_index )
    {
      c = 3;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::LinePattern, m_linetype_index);
      if (!rc) break;
    }
    if ( -1 != m_material_index && MaterialSource() == ON::material_from_object)
    {
      c = 4;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::RenderMaterial, m_material_index);
      if (!rc) break;
    }
    if (    m_rendering_attributes.m_mappings.Count() > 0
         || m_rendering_attributes.m_materials.Count() > 0
         || true != m_rendering_attributes.m_bCastsShadows
         || true != m_rendering_attributes.m_bReceivesShadows
         || false != m_rendering_attributes.AdvancedTexturePreview()
         )
    {
      c = 5;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = m_rendering_attributes.Write(file);
      if (!rc) break;
    }
    if ( 0 != m_color )
    {
      c = 6;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteColor(m_color);
      if (!rc) break;
    }
    if ( 0 != m_plot_color )
    {
      c = 7;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteColor(m_plot_color);
      if (!rc) break;
    }
    if ( 0.0 != m_plot_weight_mm )
    {
      c = 8;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteDouble(m_plot_weight_mm);
      if (!rc) break;
    }
    if ( ON::no_object_decoration != m_object_decoration )
    {
      c = 9;
      rc = file.WriteChar(c);
      if (!rc) break;
      c = (unsigned char)m_object_decoration;
      rc = file.WriteChar(c);
      if (!rc) break;
    }
    if ( 1 != m_wire_density )
    {
      c = 10;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteInt(m_wire_density);
      if (!rc) break;
    }
    if ( true != m_bVisible )
    {
      c = 11;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(m_bVisible);
      if (!rc) break;
    }
    if ( ON::normal_object != m_mode )
    {
      c = 12;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_mode);
      if (!rc) break;
    }
    if ( ON::color_from_layer != m_color_source )
    {
      c = 13;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_color_source);
      if (!rc) break;
    }
    if ( ON::plot_color_from_layer != m_plot_color_source )
    {
      c = 14;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_plot_color_source);
      if (!rc) break;
    }
    if ( ON::plot_weight_from_layer != m_plot_weight_source )
    {
      c = 15;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_plot_weight_source);
      if (!rc) break;
    }
    if ( ON::material_from_layer != m_material_source )
    {
      c = 16;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_material_source);
      if (!rc) break;
    }
    if ( ON::linetype_from_layer != m_linetype_source )
    {
      c = 17;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar(m_linetype_source);
      if (!rc) break;
    }
    if ( m_group.Count() > 0 )
    {
      c = 18;
      rc = file.WriteChar(c);
      if (!rc) break;
      int count = m_group.Count();
      rc = file.WriteInt(count);
      for ( int i = 0; i < count && rc; i++)
        rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::Group, m_group[i]);
      if (!rc) break;
    }
    if ( ON::model_space != m_space )
    {
      c = 19;
      rc = file.WriteChar(c);
      if (!rc) break;
      c = (unsigned char)m_space;
      rc = file.WriteChar(c);
      if (!rc) break;
    }
    if ( !ON_UuidIsNil(m_viewport_id) )
    {
      c = 20;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteUuid(m_viewport_id);
      if (!rc) break;
    }
    if ( m_dmref.Count() > 0 )
    {
      c = 21;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteArray(m_dmref);
      if (!rc) break;
    }

    // 29 Nov. 2009 - S. Baer
    // Only write m_display_order if it's value!=0
    // m_display_order is written to version 2.1 files
    if ( 0 != m_display_order )
    {
      c = 22;
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteInt(m_display_order);
      if (!rc) break;
    }

    const ON_SectionStyle* customSectionStyle = CustomSectionStyle();
    // 12 Aug 2021 S. Baer
    // Items 23, 24, 25, 26 were in a version of Rhino 8 WIP for about 24 hours.
    // They were most likely never used by anyone

    // New attribute non-default values are all held in the m_private variable.
    // If this variable is nullptr, then all of the following properties will
    // be default which means there is no need to check their state
    if (m_private)
    {
      //if (ClipParticipationSource() != ON::ClipParticipationSource::FromLayer)
      //{
      //  c = ON_3dmObjectAttributesTypeCodes::ClipParticipationSource; // 27
      //  rc = file.WriteChar(c);
      //  if (!rc) break;
      //  rc = file.WriteChar((unsigned char)ClipParticipationSource());
      //  if (!rc) break;
      //}

      //{
      //  bool forAllClippingPlanes = true;
      //  bool forNoClippingPlanes = false;
      //  ON_UuidList selectiveClipping;
      //  bool isParticipationList = true;
      //  GetClipParticipation(forAllClippingPlanes, forNoClippingPlanes, selectiveClipping, isParticipationList);
      //  if (!forAllClippingPlanes)
      //  {
      //    c = ON_3dmObjectAttributesTypeCodes::SelectiveClippingData; // 28
      //    rc = file.WriteChar(c);
      //    if (!rc) break;
      //    rc = file.WriteBool(forNoClippingPlanes);
      //    if (!rc) break;
      //    rc = selectiveClipping.Write(file);
      //    if (!rc) break;
      //  }
      //}

      if (SectionAttributesSource() != ON::SectionAttributesSource::FromLayer)
      {
        c = ON_3dmObjectAttributesTypeCodes::SectionAttributesSource; // 29
        rc = file.WriteChar(c);
        if (!rc) break;
        rc = file.WriteChar((unsigned char)SectionAttributesSource());
        if (!rc) break;
      }

      // 23 April 2023 S. Baer
      // Stop writing individual section attributes. All section attribute IO has been
      // moved to writing an ON_SectionStyle instance
      //if (customSectionStyle)
      //{
      //  if (customSectionStyle->HatchIndex() != ON_UNSET_INT_INDEX)
      //  {
      //    c = ON_3dmObjectAttributesTypeCodes::SectionHatchIndex; // 30
      //    rc = file.WriteChar(c);
      //    if (!rc) break;
      //    rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, customSectionStyle->HatchIndex());
      //    if (!rc) break;
      //  }

      //  if (customSectionStyle->HatchScale() != 1.0)
      //  {
      //    c = ON_3dmObjectAttributesTypeCodes::SectionHatchScale; // 31
      //    rc = file.WriteChar(c);
      //    if (!rc) break;
      //    rc = file.WriteDouble(customSectionStyle->HatchScale());
      //    if (!rc) break;
      //  }

      //  if (customSectionStyle->HatchRotation() != 0.0)
      //  {
      //    c = ON_3dmObjectAttributesTypeCodes::SectionHatchRotation; // 32
      //    rc = file.WriteChar(c);
      //    if (!rc) break;
      //    rc = file.WriteDouble(customSectionStyle->HatchRotation());
      //    if (!rc) break;
      //  }
      //}

      if (fabs(1.0 - LinetypePatternScale()) > ON_EPSILON)
      {
        c = ON_3dmObjectAttributesTypeCodes::LinetypeScale; // 33
        rc = file.WriteChar(c);
        if (!rc) break;
        rc = file.WriteDouble(LinetypePatternScale());
        if (!rc) break;
      }

      if (HatchBackgroundFillColor() != ON_Color::UnsetColor)
      {
        c = ON_3dmObjectAttributesTypeCodes::HatchBackgroundFill; // 34
        rc = file.WriteChar(c);
        if (!rc) break;
        rc = file.WriteColor(HatchBackgroundFillColor());
        if (!rc) break;
      }

      if (HatchBoundaryVisible() != false)
      {
        c = ON_3dmObjectAttributesTypeCodes::HatchBoundaryVisible; // 35
        rc = file.WriteChar(c);
        if (!rc) break;
        rc = file.WriteBool(HatchBoundaryVisible());
        if (!rc) break;
      }
    }

    // 15 Jun 2022 S. Baer
    // Do not write items if they are their default value.
    if (m_object_frame != ON_Plane::UnsetPlane)
    {
      // 26 Jan 2022 Andy Le Bihan
      // Always write the object frame - it will always be initialized.
      c = ON_3dmObjectAttributesTypeCodes::ObjectFrame;
      rc = file.WriteChar(c);
      if (!rc) break;

      ON_Xform xform;
      xform.ChangeBasis(m_object_frame, ON_Plane::World_xy);
      rc = file.WriteXform(xform);
      if (!rc) break;
    }

    // 23 April 2023 S. Baer
    // Stop writing individual section attributes. All section attribute IO has been
    // moved to writing an ON_SectionStyle instance
    //if (customSectionStyle)
    //{
    //  if (customSectionStyle->SectionFillRule() != ON::SectionFillRule::ClosedCurves)
    //  {
    //    c = ON_3dmObjectAttributesTypeCodes::SectionFillRule; // 37
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteChar((unsigned char)(customSectionStyle->SectionFillRule()));
    //    if (!rc) break;
    //  }
    //}

    // 30 Nov 2022 S. Baer
    // Write custom linetype
    {
      const ON_Linetype* linetype = CustomLinetype();
      if (linetype)
      {
        c = ON_3dmObjectAttributesTypeCodes::CustomLinetype; // 38
        rc = file.WriteChar(c);
        if (!rc) break;
        rc = linetype->Write(file);
        if (!rc) break;
      }
    }

    // 18 Apr 2023 S. Baer
    // Write custom section style
    if (customSectionStyle && !customSectionStyle->SectionAttributesEqual(ON_SectionStyle::Unset))
    {
      c = ON_3dmObjectAttributesTypeCodes::CustomSectionStyle; // 39
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = customSectionStyle->Write(file);
      if (!rc) break;
    }

    if (ClippingPlaneLabelStyle() != ON::SectionLabelStyle::None)
    {
      c = ON_3dmObjectAttributesTypeCodes::ClippingPlaneLabelStyle; // 40
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteChar((unsigned char)(ClippingPlaneLabelStyle()));
      if (!rc) break;
    }

    //if (m_private && false == m_private->m_clipplane_list_is_participation)
    //{
    //  c = ON_3dmObjectAttributesTypeCodes::SelectiveClippingListType; //41
    //  rc = file.WriteChar(c);
    //  if (!rc) break;
    //  rc = file.WriteBool(m_private->m_clipplane_list_is_participation);
    //  if (!rc) break;
    //}

    // 0 indicates end of attributes - this should be the last item written
    c = 0;
    rc = file.WriteChar(c);
    break;
  }
  return rc;
}